

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Scene *pSVar10;
  undefined8 uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  RayQueryContext *pRVar17;
  undefined8 uVar18;
  uint uVar19;
  Scene *pSVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  RayQueryContext *pRVar24;
  size_t sVar25;
  ulong uVar26;
  float fVar38;
  float fVar39;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar40;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  vint4 bi;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar59;
  float fVar61;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar76;
  float fVar77;
  undefined1 auVar73 [16];
  float fVar78;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar80;
  float fVar81;
  undefined1 auVar79 [16];
  float fVar82;
  float fVar83;
  vint4 ai;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  vint4 bi_1;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  vint4 ai_3;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  vint4 ai_1;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  Intersectors *local_1098;
  size_t local_1090;
  Precalculations *local_1088;
  RayHitK<4> *local_1080;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [3912];
  
  local_1088 = pre;
  local_1098 = This;
  pRVar24 = (RayQueryContext *)(local_f78 + 0x10);
  local_f78._0_8_ = root.ptr;
  local_f78._8_4_ = 0;
  local_1028 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_10a8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fe8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  local_ff8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  local_1008 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  local_1038 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1048 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1058 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1078 = local_1038 * 0.99999964;
  local_10b8 = local_1048 * 0.99999964;
  local_1068 = local_1058 * 0.99999964;
  local_1038 = local_1038 * 1.0000004;
  local_1048 = local_1048 * 1.0000004;
  local_1058 = local_1058 * 1.0000004;
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar41 = (tray->tnear).field_0.i[k];
  local_10c8._4_4_ = iVar41;
  local_10c8._0_4_ = iVar41;
  local_10c8._8_4_ = iVar41;
  local_10c8._12_4_ = iVar41;
  iVar41 = (tray->tfar).field_0.i[k];
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_10a4 = local_10a8;
  fStack_10a0 = local_10a8;
  fStack_109c = local_10a8;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  fStack_1074 = local_1078;
  fStack_1070 = local_1078;
  fStack_106c = local_1078;
  fStack_10b4 = local_10b8;
  fStack_10b0 = local_10b8;
  fStack_10ac = local_10b8;
  local_1080 = ray;
  local_1090 = k;
  sVar25 = k;
  iVar42 = iVar41;
  iVar43 = iVar41;
  iVar44 = iVar41;
  auVar49 = local_10c8;
  fVar86 = local_1038;
  fVar87 = local_1038;
  fVar88 = local_1038;
  fVar89 = local_1038;
  fVar76 = local_1048;
  fVar38 = local_1048;
  fVar80 = local_1048;
  fVar77 = local_1048;
  fVar39 = local_1058;
  fVar81 = local_1058;
  fVar78 = local_1058;
  fVar40 = local_1058;
  fVar50 = local_1068;
  fVar51 = local_1068;
  fVar59 = local_1068;
  fVar60 = local_1068;
  fVar61 = local_10a8;
  fVar62 = local_10a8;
  fVar63 = local_10a8;
  fVar64 = local_10a8;
  fVar82 = local_1078;
  fVar83 = local_1078;
  fVar90 = local_1078;
  fVar91 = local_1078;
  fVar92 = local_1028;
  fVar93 = local_1028;
  fVar94 = local_1028;
  fVar95 = local_1028;
  fVar96 = local_10b8;
  fVar97 = local_10b8;
  fVar98 = local_10b8;
  fVar99 = local_10b8;
LAB_00723a12:
  do {
    do {
      if (pRVar24 == (RayQueryContext *)local_f78) {
        return;
      }
      pRVar17 = pRVar24 + -1;
      pRVar24 = (RayQueryContext *)&pRVar24[-1].user;
    } while (*(float *)(ray + sVar25 * 4 + 0x80) <= *(float *)&pRVar17->args &&
             *(float *)&pRVar17->args != *(float *)(ray + sVar25 * 4 + 0x80));
    pSVar20 = *(Scene **)pRVar24;
    while (((ulong)pSVar20 & 8) == 0) {
      fVar6 = *(float *)(ray + sVar25 * 4 + 0x70);
      uVar19 = (uint)pSVar20 & 7;
      uVar23 = (ulong)pSVar20 & 0xfffffffffffffff0;
      if (uVar19 == 3) {
        local_f98 = *(float *)(uVar23 + 0x20);
        fStack_f94 = *(float *)(uVar23 + 0x24);
        fStack_f90 = *(float *)(uVar23 + 0x28);
        fStack_f8c = *(float *)(uVar23 + 0x2c);
        local_fb8 = *(float *)(uVar23 + 0x50);
        fStack_fb4 = *(float *)(uVar23 + 0x54);
        fStack_fb0 = *(float *)(uVar23 + 0x58);
        fStack_fac = *(float *)(uVar23 + 0x5c);
        local_fa8 = *(float *)(uVar23 + 0x60);
        fStack_fa4 = *(float *)(uVar23 + 100);
        fStack_fa0 = *(float *)(uVar23 + 0x68);
        fStack_f9c = *(float *)(uVar23 + 0x6c);
        local_fd8 = *(float *)(uVar23 + 0x80);
        fStack_fd4 = *(float *)(uVar23 + 0x84);
        fStack_fd0 = *(float *)(uVar23 + 0x88);
        fStack_fcc = *(float *)(uVar23 + 0x8c);
        local_fc8 = *(float *)(uVar23 + 0x90);
        fStack_fc4 = *(float *)(uVar23 + 0x94);
        fStack_fc0 = *(float *)(uVar23 + 0x98);
        fStack_fbc = *(float *)(uVar23 + 0x9c);
        local_1018 = *(undefined8 *)(uVar23 + 0xa0);
        uStack_1010 = *(undefined8 *)(uVar23 + 0xa8);
        uVar11 = local_1018;
        uVar18 = uStack_1010;
        fVar82 = 1.0 - fVar6;
        fVar83 = fVar82 * 0.0;
        local_f88 = *(float *)(uVar23 + 0x110) * fVar6 + fVar82;
        fStack_f84 = *(float *)(uVar23 + 0x114) * fVar6 + fVar82;
        fStack_f80 = *(float *)(uVar23 + 0x118) * fVar6 + fVar82;
        fStack_f7c = *(float *)(uVar23 + 0x11c) * fVar6 + fVar82;
        auVar84._0_4_ = local_fe8 * local_f98 + local_ff8 * local_fb8 + local_1008 * local_fd8;
        auVar84._4_4_ = fStack_fe4 * fStack_f94 + fStack_ff4 * fStack_fb4 + fStack_1004 * fStack_fd4
        ;
        auVar84._8_4_ = fStack_fe0 * fStack_f90 + fStack_ff0 * fStack_fb0 + fStack_1000 * fStack_fd0
        ;
        auVar84._12_4_ = fStack_fdc * fStack_f8c + fStack_fec * fStack_fac + fStack_ffc * fStack_fcc
        ;
        fVar86 = (float)DAT_01f4bd50;
        fVar87 = DAT_01f4bd50._4_4_;
        fVar88 = DAT_01f4bd50._8_4_;
        fVar89 = DAT_01f4bd50._12_4_;
        auVar28._4_4_ = -(uint)(ABS(auVar84._4_4_) < fVar87);
        auVar28._0_4_ = -(uint)(ABS(auVar84._0_4_) < fVar86);
        auVar28._8_4_ = -(uint)(ABS(auVar84._8_4_) < fVar88);
        auVar28._12_4_ = -(uint)(ABS(auVar84._12_4_) < fVar89);
        auVar75 = blendvps(auVar84,_DAT_01f4bd50,auVar28);
        local_10f8 = (float)*(undefined8 *)(uVar23 + 0x30);
        fStack_10f4 = (float)((ulong)*(undefined8 *)(uVar23 + 0x30) >> 0x20);
        fStack_10f0 = (float)*(undefined8 *)(uVar23 + 0x38);
        fStack_10ec = (float)((ulong)*(undefined8 *)(uVar23 + 0x38) >> 0x20);
        auVar68._0_4_ = local_fe8 * local_10f8 + local_ff8 * local_fa8 + local_1008 * local_fc8;
        auVar68._4_4_ =
             fStack_fe4 * fStack_10f4 + fStack_ff4 * fStack_fa4 + fStack_1004 * fStack_fc4;
        auVar68._8_4_ =
             fStack_fe0 * fStack_10f0 + fStack_ff0 * fStack_fa0 + fStack_1000 * fStack_fc0;
        auVar68._12_4_ =
             fStack_fdc * fStack_10ec + fStack_fec * fStack_f9c + fStack_ffc * fStack_fbc;
        auVar66._4_4_ = -(uint)(ABS(auVar68._4_4_) < fVar87);
        auVar66._0_4_ = -(uint)(ABS(auVar68._0_4_) < fVar86);
        auVar66._8_4_ = -(uint)(ABS(auVar68._8_4_) < fVar88);
        auVar66._12_4_ = -(uint)(ABS(auVar68._12_4_) < fVar89);
        auVar66 = blendvps(auVar68,_DAT_01f4bd50,auVar66);
        local_1018._4_4_ = (float)((ulong)local_1018 >> 0x20);
        uStack_1010._4_4_ = (float)((ulong)uStack_1010 >> 0x20);
        auVar55._0_4_ =
             local_fe8 * *(float *)(uVar23 + 0x40) +
             local_ff8 * *(float *)(uVar23 + 0x70) + local_1008 * (float)local_1018;
        auVar55._4_4_ =
             fStack_fe4 * *(float *)(uVar23 + 0x44) +
             fStack_ff4 * *(float *)(uVar23 + 0x74) + fStack_1004 * local_1018._4_4_;
        auVar55._8_4_ =
             fStack_fe0 * *(float *)(uVar23 + 0x48) +
             fStack_ff0 * *(float *)(uVar23 + 0x78) + fStack_1000 * (float)uStack_1010;
        auVar55._12_4_ =
             fStack_fdc * *(float *)(uVar23 + 0x4c) +
             fStack_fec * *(float *)(uVar23 + 0x7c) + fStack_ffc * uStack_1010._4_4_;
        auVar72._4_4_ = -(uint)(ABS(auVar55._4_4_) < fVar87);
        auVar72._0_4_ = -(uint)(ABS(auVar55._0_4_) < fVar86);
        auVar72._8_4_ = -(uint)(ABS(auVar55._8_4_) < fVar88);
        auVar72._12_4_ = -(uint)(ABS(auVar55._12_4_) < fVar89);
        auVar28 = blendvps(auVar55,_DAT_01f4bd50,auVar72);
        auVar49 = rcpps(auVar72,auVar75);
        fVar86 = auVar49._0_4_;
        fVar89 = auVar49._4_4_;
        fVar80 = auVar49._8_4_;
        fVar81 = auVar49._12_4_;
        fVar86 = (1.0 - auVar75._0_4_ * fVar86) * fVar86 + fVar86;
        fVar89 = (1.0 - auVar75._4_4_ * fVar89) * fVar89 + fVar89;
        fVar80 = (1.0 - auVar75._8_4_ * fVar80) * fVar80 + fVar80;
        fVar81 = (1.0 - auVar75._12_4_ * fVar81) * fVar81 + fVar81;
        auVar49 = rcpps(auVar49,auVar66);
        fVar87 = auVar49._0_4_;
        auVar69._0_4_ = auVar66._0_4_ * fVar87;
        fVar76 = auVar49._4_4_;
        auVar69._4_4_ = auVar66._4_4_ * fVar76;
        fVar77 = auVar49._8_4_;
        auVar69._8_4_ = auVar66._8_4_ * fVar77;
        fVar78 = auVar49._12_4_;
        auVar69._12_4_ = auVar66._12_4_ * fVar78;
        fVar87 = (1.0 - auVar69._0_4_) * fVar87 + fVar87;
        fVar76 = (1.0 - auVar69._4_4_) * fVar76 + fVar76;
        fVar77 = (1.0 - auVar69._8_4_) * fVar77 + fVar77;
        fVar78 = (1.0 - auVar69._12_4_) * fVar78 + fVar78;
        auVar49 = rcpps(auVar69,auVar28);
        fVar88 = auVar49._0_4_;
        fVar38 = auVar49._4_4_;
        fVar39 = auVar49._8_4_;
        fVar40 = auVar49._12_4_;
        fVar88 = (1.0 - auVar28._0_4_ * fVar88) * fVar88 + fVar88;
        fVar38 = (1.0 - auVar28._4_4_ * fVar38) * fVar38 + fVar38;
        fVar39 = (1.0 - auVar28._8_4_ * fVar39) * fVar39 + fVar39;
        fVar40 = (1.0 - auVar28._12_4_ * fVar40) * fVar40 + fVar40;
        fVar50 = local_f98 * local_1028 +
                 local_fb8 * local_10a8 + local_fd8 * fVar5 + *(float *)(uVar23 + 0xb0);
        fVar59 = fStack_f94 * fStack_1024 +
                 fStack_fb4 * fStack_10a4 + fStack_fd4 * fVar5 + *(float *)(uVar23 + 0xb4);
        fVar61 = fStack_f90 * fStack_1020 +
                 fStack_fb0 * fStack_10a0 + fStack_fd0 * fVar5 + *(float *)(uVar23 + 0xb8);
        fVar63 = fStack_f8c * fStack_101c +
                 fStack_fac * fStack_109c + fStack_fcc * fVar5 + *(float *)(uVar23 + 0xbc);
        fVar51 = local_10f8 * local_1028 +
                 local_fa8 * local_10a8 + local_fc8 * fVar5 + *(float *)(uVar23 + 0xc0);
        fVar60 = fStack_10f4 * fStack_1024 +
                 fStack_fa4 * fStack_10a4 + fStack_fc4 * fVar5 + *(float *)(uVar23 + 0xc4);
        fVar62 = fStack_10f0 * fStack_1020 +
                 fStack_fa0 * fStack_10a0 + fStack_fc0 * fVar5 + *(float *)(uVar23 + 200);
        fVar64 = fStack_10ec * fStack_101c +
                 fStack_f9c * fStack_109c + fStack_fbc * fVar5 + *(float *)(uVar23 + 0xcc);
        fVar98 = *(float *)(uVar23 + 0x40) * local_1028 +
                 *(float *)(uVar23 + 0x70) * local_10a8 +
                 (float)local_1018 * fVar5 + *(float *)(uVar23 + 0xd0);
        fVar99 = *(float *)(uVar23 + 0x44) * fStack_1024 +
                 *(float *)(uVar23 + 0x74) * fStack_10a4 +
                 local_1018._4_4_ * fVar5 + *(float *)(uVar23 + 0xd4);
        fVar100 = *(float *)(uVar23 + 0x48) * fStack_1020 +
                  *(float *)(uVar23 + 0x78) * fStack_10a0 +
                  (float)uStack_1010 * fVar5 + *(float *)(uVar23 + 0xd8);
        fVar101 = *(float *)(uVar23 + 0x4c) * fStack_101c +
                  *(float *)(uVar23 + 0x7c) * fStack_109c +
                  uStack_1010._4_4_ * fVar5 + *(float *)(uVar23 + 0xdc);
        fVar94 = ((*(float *)(uVar23 + 0xe0) * fVar6 + fVar83) - fVar50) * fVar86;
        fVar95 = ((*(float *)(uVar23 + 0xe4) * fVar6 + fVar83) - fVar59) * fVar89;
        fVar96 = ((*(float *)(uVar23 + 0xe8) * fVar6 + fVar83) - fVar61) * fVar80;
        fVar97 = ((*(float *)(uVar23 + 0xec) * fVar6 + fVar83) - fVar63) * fVar81;
        fVar86 = (local_f88 - fVar50) * fVar86;
        fVar89 = (fStack_f84 - fVar59) * fVar89;
        fVar80 = (fStack_f80 - fVar61) * fVar80;
        fVar81 = (fStack_f7c - fVar63) * fVar81;
        fVar90 = ((*(float *)(uVar23 + 0xf0) * fVar6 + fVar83) - fVar51) * fVar87;
        fVar91 = ((*(float *)(uVar23 + 0xf4) * fVar6 + fVar83) - fVar60) * fVar76;
        fVar92 = ((*(float *)(uVar23 + 0xf8) * fVar6 + fVar83) - fVar62) * fVar77;
        fVar93 = ((*(float *)(uVar23 + 0xfc) * fVar6 + fVar83) - fVar64) * fVar78;
        fVar50 = ((fVar83 + *(float *)(uVar23 + 0x100) * fVar6) - fVar98) * fVar88;
        fVar59 = ((fVar83 + *(float *)(uVar23 + 0x104) * fVar6) - fVar99) * fVar38;
        fVar61 = ((fVar83 + *(float *)(uVar23 + 0x108) * fVar6) - fVar100) * fVar39;
        fVar63 = ((fVar83 + *(float *)(uVar23 + 0x10c) * fVar6) - fVar101) * fVar40;
        fVar87 = ((*(float *)(uVar23 + 0x120) * fVar6 + fVar82) - fVar51) * fVar87;
        fVar76 = ((*(float *)(uVar23 + 0x124) * fVar6 + fVar82) - fVar60) * fVar76;
        fVar77 = ((*(float *)(uVar23 + 0x128) * fVar6 + fVar82) - fVar62) * fVar77;
        fVar78 = ((*(float *)(uVar23 + 300) * fVar6 + fVar82) - fVar64) * fVar78;
        fVar88 = ((fVar6 * *(float *)(uVar23 + 0x130) + fVar82) - fVar98) * fVar88;
        fVar38 = ((fVar6 * *(float *)(uVar23 + 0x134) + fVar82) - fVar99) * fVar38;
        fVar39 = ((fVar6 * *(float *)(uVar23 + 0x138) + fVar82) - fVar100) * fVar39;
        fVar40 = ((fVar6 * *(float *)(uVar23 + 0x13c) + fVar82) - fVar101) * fVar40;
        auVar75._0_4_ =
             (uint)((int)fVar87 < (int)fVar90) * (int)fVar87 |
             (uint)((int)fVar87 >= (int)fVar90) * (int)fVar90;
        auVar75._4_4_ =
             (uint)((int)fVar76 < (int)fVar91) * (int)fVar76 |
             (uint)((int)fVar76 >= (int)fVar91) * (int)fVar91;
        auVar75._8_4_ =
             (uint)((int)fVar77 < (int)fVar92) * (int)fVar77 |
             (uint)((int)fVar77 >= (int)fVar92) * (int)fVar92;
        auVar75._12_4_ =
             (uint)((int)fVar78 < (int)fVar93) * (int)fVar78 |
             (uint)((int)fVar78 >= (int)fVar93) * (int)fVar93;
        auVar56._0_4_ =
             (uint)((int)fVar88 < (int)fVar50) * (int)fVar88 |
             (uint)((int)fVar88 >= (int)fVar50) * (int)fVar50;
        auVar56._4_4_ =
             (uint)((int)fVar38 < (int)fVar59) * (int)fVar38 |
             (uint)((int)fVar38 >= (int)fVar59) * (int)fVar59;
        auVar56._8_4_ =
             (uint)((int)fVar39 < (int)fVar61) * (int)fVar39 |
             (uint)((int)fVar39 >= (int)fVar61) * (int)fVar61;
        auVar56._12_4_ =
             (uint)((int)fVar40 < (int)fVar63) * (int)fVar40 |
             (uint)((int)fVar40 >= (int)fVar63) * (int)fVar63;
        auVar49 = maxps(auVar75,auVar56);
        auVar57._0_4_ =
             (uint)((int)fVar86 < (int)fVar94) * (int)fVar86 |
             (uint)((int)fVar86 >= (int)fVar94) * (int)fVar94;
        auVar57._4_4_ =
             (uint)((int)fVar89 < (int)fVar95) * (int)fVar89 |
             (uint)((int)fVar89 >= (int)fVar95) * (int)fVar95;
        auVar57._8_4_ =
             (uint)((int)fVar80 < (int)fVar96) * (int)fVar80 |
             (uint)((int)fVar80 >= (int)fVar96) * (int)fVar96;
        auVar57._12_4_ =
             (uint)((int)fVar81 < (int)fVar97) * (int)fVar81 |
             (uint)((int)fVar81 >= (int)fVar97) * (int)fVar97;
        auVar85._0_4_ =
             (uint)((int)fVar87 < (int)fVar90) * (int)fVar90 |
             (uint)((int)fVar87 >= (int)fVar90) * (int)fVar87;
        auVar85._4_4_ =
             (uint)((int)fVar76 < (int)fVar91) * (int)fVar91 |
             (uint)((int)fVar76 >= (int)fVar91) * (int)fVar76;
        auVar85._8_4_ =
             (uint)((int)fVar77 < (int)fVar92) * (int)fVar92 |
             (uint)((int)fVar77 >= (int)fVar92) * (int)fVar77;
        auVar85._12_4_ =
             (uint)((int)fVar78 < (int)fVar93) * (int)fVar93 |
             (uint)((int)fVar78 >= (int)fVar93) * (int)fVar78;
        auVar46._0_4_ =
             (uint)((int)fVar88 < (int)fVar50) * (int)fVar50 |
             (uint)((int)fVar88 >= (int)fVar50) * (int)fVar88;
        auVar46._4_4_ =
             (uint)((int)fVar38 < (int)fVar59) * (int)fVar59 |
             (uint)((int)fVar38 >= (int)fVar59) * (int)fVar38;
        auVar46._8_4_ =
             (uint)((int)fVar39 < (int)fVar61) * (int)fVar61 |
             (uint)((int)fVar39 >= (int)fVar61) * (int)fVar39;
        auVar46._12_4_ =
             (uint)((int)fVar40 < (int)fVar63) * (int)fVar63 |
             (uint)((int)fVar40 >= (int)fVar63) * (int)fVar40;
        auVar66 = minps(auVar85,auVar46);
        auVar28 = maxps(local_10c8,auVar57);
        auVar28 = maxps(auVar28,auVar49);
        auVar29._4_4_ = iVar42;
        auVar29._0_4_ = iVar41;
        auVar29._8_4_ = iVar43;
        auVar29._12_4_ = iVar44;
        auVar49._4_4_ =
             (uint)((int)fVar89 < (int)fVar95) * (int)fVar95 |
             (uint)((int)fVar89 >= (int)fVar95) * (int)fVar89;
        auVar49._0_4_ =
             (uint)((int)fVar86 < (int)fVar94) * (int)fVar94 |
             (uint)((int)fVar86 >= (int)fVar94) * (int)fVar86;
        auVar49._8_4_ =
             (uint)((int)fVar80 < (int)fVar96) * (int)fVar96 |
             (uint)((int)fVar80 >= (int)fVar96) * (int)fVar80;
        auVar49._12_4_ =
             (uint)((int)fVar81 < (int)fVar97) * (int)fVar97 |
             (uint)((int)fVar81 >= (int)fVar97) * (int)fVar81;
        auVar49 = minps(auVar29,auVar49);
        auVar49 = minps(auVar49,auVar66);
        local_10d8._0_4_ = auVar28._0_4_ * 0.99999964;
        local_10d8._4_4_ = auVar28._4_4_ * 0.99999964;
        fStack_10d0 = auVar28._8_4_ * 0.99999964;
        fStack_10cc = auVar28._12_4_ * 0.99999964;
        auVar47._4_4_ = -(uint)((float)local_10d8._4_4_ <= auVar49._4_4_ * 1.0000004);
        auVar47._0_4_ = -(uint)((float)local_10d8._0_4_ <= auVar49._0_4_ * 1.0000004);
        auVar47._8_4_ = -(uint)(fStack_10d0 <= auVar49._8_4_ * 1.0000004);
        auVar47._12_4_ = -(uint)(fStack_10cc <= auVar49._12_4_ * 1.0000004);
        uVar19 = movmskps((int)k,auVar47);
        auVar49 = local_10c8;
        fVar86 = local_1038;
        fVar87 = fStack_1034;
        fVar88 = fStack_1030;
        fVar89 = fStack_102c;
        fVar76 = local_1048;
        fVar38 = fStack_1044;
        fVar80 = fStack_1040;
        fVar77 = fStack_103c;
        fVar39 = local_1058;
        fVar81 = fStack_1054;
        fVar78 = fStack_1050;
        fVar40 = fStack_104c;
        fVar50 = local_1068;
        fVar51 = fStack_1064;
        fVar59 = fStack_1060;
        fVar60 = fStack_105c;
        fVar61 = local_10a8;
        fVar62 = fStack_10a4;
        fVar63 = fStack_10a0;
        fVar64 = fStack_109c;
        fVar82 = local_1078;
        fVar83 = fStack_1074;
        fVar90 = fStack_1070;
        fVar91 = fStack_106c;
        fVar92 = local_1028;
        fVar93 = fStack_1024;
        fVar94 = fStack_1020;
        fVar95 = fStack_101c;
        fVar96 = local_10b8;
        fVar97 = fStack_10b4;
        fVar98 = fStack_10b0;
        fVar99 = fStack_10ac;
        local_1018 = uVar11;
        uStack_1010 = uVar18;
      }
      else {
        pfVar3 = (float *)(uVar23 + 0x80 + uVar21);
        pfVar1 = (float *)(uVar23 + 0x20 + uVar21);
        pfVar4 = (float *)(uVar23 + 0x80 + uVar26);
        pfVar2 = (float *)(uVar23 + 0x20 + uVar26);
        auVar52._0_4_ = ((*pfVar3 * fVar6 + *pfVar1) - fVar92) * fVar82;
        auVar52._4_4_ = ((pfVar3[1] * fVar6 + pfVar1[1]) - fVar93) * fVar83;
        auVar52._8_4_ = ((pfVar3[2] * fVar6 + pfVar1[2]) - fVar94) * fVar90;
        auVar52._12_4_ = ((pfVar3[3] * fVar6 + pfVar1[3]) - fVar95) * fVar91;
        auVar65._0_4_ = ((*pfVar4 * fVar6 + *pfVar2) - fVar61) * fVar96;
        auVar65._4_4_ = ((pfVar4[1] * fVar6 + pfVar2[1]) - fVar62) * fVar97;
        auVar65._8_4_ = ((pfVar4[2] * fVar6 + pfVar2[2]) - fVar63) * fVar98;
        auVar65._12_4_ = ((pfVar4[3] * fVar6 + pfVar2[3]) - fVar64) * fVar99;
        pfVar2 = (float *)(uVar23 + 0x80 + uVar22);
        pfVar1 = (float *)(uVar23 + 0x20 + uVar22);
        auVar27._0_4_ = ((*pfVar2 * fVar6 + *pfVar1) - fVar5) * fVar50;
        auVar27._4_4_ = ((pfVar2[1] * fVar6 + pfVar1[1]) - fVar5) * fVar51;
        auVar27._8_4_ = ((pfVar2[2] * fVar6 + pfVar1[2]) - fVar5) * fVar59;
        auVar27._12_4_ = ((pfVar2[3] * fVar6 + pfVar1[3]) - fVar5) * fVar60;
        auVar66 = maxps(auVar65,auVar27);
        auVar28 = maxps(auVar49,auVar52);
        pfVar2 = (float *)(uVar23 + 0x80 + (uVar21 ^ 0x10));
        pfVar1 = (float *)(uVar23 + 0x20 + (uVar21 ^ 0x10));
        _local_10d8 = maxps(auVar28,auVar66);
        auVar73._0_4_ = ((*pfVar2 * fVar6 + *pfVar1) - fVar92) * fVar86;
        auVar73._4_4_ = ((pfVar2[1] * fVar6 + pfVar1[1]) - fVar93) * fVar87;
        auVar73._8_4_ = ((pfVar2[2] * fVar6 + pfVar1[2]) - fVar94) * fVar88;
        auVar73._12_4_ = ((pfVar2[3] * fVar6 + pfVar1[3]) - fVar95) * fVar89;
        pfVar3 = (float *)(uVar23 + 0x80 + (uVar26 ^ 0x10));
        pfVar1 = (float *)(uVar23 + 0x20 + (uVar26 ^ 0x10));
        pfVar4 = (float *)(uVar23 + 0x80 + (uVar22 ^ 0x10));
        pfVar2 = (float *)(uVar23 + 0x20 + (uVar22 ^ 0x10));
        auVar67._0_4_ = ((*pfVar3 * fVar6 + *pfVar1) - fVar61) * fVar76;
        auVar67._4_4_ = ((pfVar3[1] * fVar6 + pfVar1[1]) - fVar62) * fVar38;
        auVar67._8_4_ = ((pfVar3[2] * fVar6 + pfVar1[2]) - fVar63) * fVar80;
        auVar67._12_4_ = ((pfVar3[3] * fVar6 + pfVar1[3]) - fVar64) * fVar77;
        auVar53._0_4_ = ((*pfVar4 * fVar6 + *pfVar2) - fVar5) * fVar39;
        auVar53._4_4_ = ((pfVar4[1] * fVar6 + pfVar2[1]) - fVar5) * fVar81;
        auVar53._8_4_ = ((pfVar4[2] * fVar6 + pfVar2[2]) - fVar5) * fVar78;
        auVar53._12_4_ = ((pfVar4[3] * fVar6 + pfVar2[3]) - fVar5) * fVar40;
        auVar66 = minps(auVar67,auVar53);
        auVar54._4_4_ = iVar42;
        auVar54._0_4_ = iVar41;
        auVar54._8_4_ = iVar43;
        auVar54._12_4_ = iVar44;
        auVar28 = minps(auVar54,auVar73);
        auVar28 = minps(auVar28,auVar66);
        if (uVar19 == 6) {
          bVar13 = (fVar6 < *(float *)(uVar23 + 0xf0) && *(float *)(uVar23 + 0xe0) <= fVar6) &&
                   local_10d8._0_4_ <= auVar28._0_4_;
          bVar14 = (fVar6 < *(float *)(uVar23 + 0xf4) && *(float *)(uVar23 + 0xe4) <= fVar6) &&
                   local_10d8._4_4_ <= auVar28._4_4_;
          bVar15 = (fVar6 < *(float *)(uVar23 + 0xf8) && *(float *)(uVar23 + 0xe8) <= fVar6) &&
                   local_10d8._8_4_ <= auVar28._8_4_;
          bVar16 = (fVar6 < *(float *)(uVar23 + 0xfc) && *(float *)(uVar23 + 0xec) <= fVar6) &&
                   local_10d8._12_4_ <= auVar28._12_4_;
        }
        else {
          bVar13 = local_10d8._0_4_ <= auVar28._0_4_;
          bVar14 = local_10d8._4_4_ <= auVar28._4_4_;
          bVar15 = local_10d8._8_4_ <= auVar28._8_4_;
          bVar16 = local_10d8._12_4_ <= auVar28._12_4_;
        }
        auVar45._0_4_ = (uint)bVar13 * -0x80000000;
        auVar45._4_4_ = (uint)bVar14 * -0x80000000;
        auVar45._8_4_ = (uint)bVar15 * -0x80000000;
        auVar45._12_4_ = (uint)bVar16 * -0x80000000;
        uVar19 = movmskps((int)k,auVar45);
      }
      k = CONCAT44((int)(k >> 0x20),uVar19);
      if ((RayQueryContext *)k == (RayQueryContext *)0x0) goto LAB_00723a12;
      lVar12 = 0;
      if ((RayQueryContext *)k != (RayQueryContext *)0x0) {
        for (; (k >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
        }
      }
      pSVar20 = *(Scene **)(uVar23 + lVar12 * 8);
      uVar19 = uVar19 - 1 & uVar19;
      k = (size_t)pRVar24;
      if (uVar19 != 0) {
        uVar7 = *(uint *)(local_10d8 + lVar12 * 4);
        lVar12 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        pSVar10 = *(Scene **)(uVar23 + lVar12 * 8);
        uVar8 = *(uint *)(local_10d8 + lVar12 * 4);
        uVar19 = uVar19 - 1 & uVar19;
        if (uVar19 == 0) {
          k = (size_t)&pRVar24->args;
          if (uVar7 < uVar8) {
            pRVar24->scene = pSVar10;
            *(uint *)&pRVar24->user = uVar8;
            pRVar24 = (RayQueryContext *)k;
          }
          else {
            pRVar24->scene = pSVar20;
            *(uint *)&pRVar24->user = uVar7;
            pSVar20 = pSVar10;
            pRVar24 = (RayQueryContext *)k;
          }
        }
        else {
          auVar48._8_4_ = uVar7;
          auVar48._0_8_ = pSVar20;
          auVar48._12_4_ = 0;
          auVar70._8_4_ = uVar8;
          auVar70._0_8_ = pSVar10;
          auVar70._12_4_ = 0;
          lVar12 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          uVar11 = *(undefined8 *)(uVar23 + lVar12 * 8);
          iVar9 = *(int *)(local_10d8 + lVar12 * 4);
          auVar58._8_4_ = iVar9;
          auVar58._0_8_ = uVar11;
          auVar58._12_4_ = 0;
          auVar30._8_4_ = -(uint)((int)uVar7 < (int)uVar8);
          uVar19 = uVar19 - 1 & uVar19;
          if (uVar19 == 0) {
            auVar30._4_4_ = auVar30._8_4_;
            auVar30._0_4_ = auVar30._8_4_;
            auVar30._12_4_ = auVar30._8_4_;
            auVar74._8_4_ = uVar8;
            auVar74._0_8_ = pSVar10;
            auVar74._12_4_ = 0;
            auVar66 = blendvps(auVar74,auVar48,auVar30);
            auVar28 = blendvps(auVar48,auVar70,auVar30);
            auVar31._8_4_ = -(uint)(auVar66._8_4_ < iVar9);
            auVar31._4_4_ = auVar31._8_4_;
            auVar31._0_4_ = auVar31._8_4_;
            auVar31._12_4_ = auVar31._8_4_;
            auVar71._8_4_ = iVar9;
            auVar71._0_8_ = uVar11;
            auVar71._12_4_ = 0;
            auVar72 = blendvps(auVar71,auVar66,auVar31);
            auVar75 = blendvps(auVar66,auVar58,auVar31);
            auVar32._8_4_ = -(uint)(auVar28._8_4_ < auVar75._8_4_);
            auVar32._4_4_ = auVar32._8_4_;
            auVar32._0_4_ = auVar32._8_4_;
            auVar32._12_4_ = auVar32._8_4_;
            auVar66 = blendvps(auVar75,auVar28,auVar32);
            auVar28 = blendvps(auVar28,auVar75,auVar32);
            pRVar24->scene = (Scene *)auVar28._0_8_;
            pRVar24->user = (RTCRayQueryContext *)auVar28._8_8_;
            *(undefined1 (*) [16])&pRVar24->args = auVar66;
            pSVar20 = auVar72._0_8_;
            pRVar24 = (RayQueryContext *)&pRVar24[1].user;
            k = (size_t)pRVar24;
          }
          else {
            lVar12 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            auVar33._4_4_ = auVar30._8_4_;
            auVar33._0_4_ = auVar30._8_4_;
            auVar33._8_4_ = auVar30._8_4_;
            auVar33._12_4_ = auVar30._8_4_;
            auVar72 = blendvps(auVar70,auVar48,auVar33);
            auVar49 = blendvps(auVar48,auVar70,auVar33);
            auVar79._8_4_ = *(int *)(local_10d8 + lVar12 * 4);
            auVar79._0_8_ = *(undefined8 *)(uVar23 + lVar12 * 8);
            auVar79._12_4_ = 0;
            auVar34._8_4_ = -(uint)(iVar9 < *(int *)(local_10d8 + lVar12 * 4));
            auVar34._4_4_ = auVar34._8_4_;
            auVar34._0_4_ = auVar34._8_4_;
            auVar34._12_4_ = auVar34._8_4_;
            auVar66 = blendvps(auVar79,auVar58,auVar34);
            auVar28 = blendvps(auVar58,auVar79,auVar34);
            auVar35._8_4_ = -(uint)(auVar49._8_4_ < auVar28._8_4_);
            auVar35._4_4_ = auVar35._8_4_;
            auVar35._0_4_ = auVar35._8_4_;
            auVar35._12_4_ = auVar35._8_4_;
            auVar75 = blendvps(auVar28,auVar49,auVar35);
            auVar49 = blendvps(auVar49,auVar28,auVar35);
            auVar36._8_4_ = -(uint)(auVar72._8_4_ < auVar66._8_4_);
            auVar36._4_4_ = auVar36._8_4_;
            auVar36._0_4_ = auVar36._8_4_;
            auVar36._12_4_ = auVar36._8_4_;
            auVar28 = blendvps(auVar66,auVar72,auVar36);
            auVar72 = blendvps(auVar72,auVar66,auVar36);
            auVar37._8_4_ = -(uint)(auVar72._8_4_ < auVar75._8_4_);
            auVar37._4_4_ = auVar37._8_4_;
            auVar37._0_4_ = auVar37._8_4_;
            auVar37._12_4_ = auVar37._8_4_;
            auVar66 = blendvps(auVar75,auVar72,auVar37);
            auVar72 = blendvps(auVar72,auVar75,auVar37);
            pRVar24->scene = (Scene *)auVar49._0_8_;
            pRVar24->user = (RTCRayQueryContext *)auVar49._8_8_;
            *(undefined1 (*) [16])&pRVar24->args = auVar72;
            pRVar24[1].user = (RTCRayQueryContext *)auVar66._0_8_;
            pRVar24[1].args = (RTCIntersectArguments *)auVar66._8_8_;
            pSVar20 = auVar28._0_8_;
            pRVar24 = pRVar24 + 2;
            k = (size_t)pRVar24;
            auVar49 = local_10c8;
            fVar96 = local_10b8;
            fVar97 = fStack_10b4;
            fVar98 = fStack_10b0;
            fVar99 = fStack_10ac;
          }
        }
      }
    }
    k = (size_t)context;
    (**(code **)((long)local_1098->leafIntersector +
                (ulong)*(byte *)((ulong)pSVar20 & 0xfffffffffffffff0) * 0x40 + 0x10))
              (local_1088,ray,sVar25);
    iVar41 = *(int *)(local_1080 + local_1090 * 4 + 0x80);
    ray = local_1080;
    sVar25 = local_1090;
    iVar42 = iVar41;
    iVar43 = iVar41;
    iVar44 = iVar41;
    auVar49 = local_10c8;
    fVar86 = local_1038;
    fVar87 = fStack_1034;
    fVar88 = fStack_1030;
    fVar89 = fStack_102c;
    fVar76 = local_1048;
    fVar38 = fStack_1044;
    fVar80 = fStack_1040;
    fVar77 = fStack_103c;
    fVar39 = local_1058;
    fVar81 = fStack_1054;
    fVar78 = fStack_1050;
    fVar40 = fStack_104c;
    fVar50 = local_1068;
    fVar51 = fStack_1064;
    fVar59 = fStack_1060;
    fVar60 = fStack_105c;
    fVar61 = local_10a8;
    fVar62 = fStack_10a4;
    fVar63 = fStack_10a0;
    fVar64 = fStack_109c;
    fVar82 = local_1078;
    fVar83 = fStack_1074;
    fVar90 = fStack_1070;
    fVar91 = fStack_106c;
    fVar92 = local_1028;
    fVar93 = fStack_1024;
    fVar94 = fStack_1020;
    fVar95 = fStack_101c;
    fVar96 = local_10b8;
    fVar97 = fStack_10b4;
    fVar98 = fStack_10b0;
    fVar99 = fStack_10ac;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }